

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O2

void TPZCompElHCurl<pzshape::TPZShapeCube>::TransformShape
               (TPZFMatrix<double> *phiref,REAL detjac,TPZFMatrix<double> *jacinv,
               TPZFMatrix<double> *axes,TPZFMatrix<double> *phi)

{
  TPZFMatrix<double> jacinvt;
  TPZFMatrix<double> axest;
  TPZFMatrix<double> local_260;
  TPZFMatrix<double> local_1d0;
  TPZFMatrix<double> local_140;
  TPZFMatrix<double> local_b0;
  
  TPZFMatrix<double>::TPZFMatrix(&local_1d0);
  TPZFMatrix<double>::TPZFMatrix(&local_260);
  (*(jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x2b])
            (jacinv,&local_260);
  (*(axes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x2b])
            (axes,&local_1d0);
  TPZFMatrix<double>::operator*(&local_140,&local_260,phiref);
  TPZFMatrix<double>::operator*(&local_b0,&local_1d0,&local_140);
  TPZFMatrix<double>::Transpose(&local_b0,&phi->super_TPZMatrix<double>);
  TPZFMatrix<double>::~TPZFMatrix(&local_b0);
  TPZFMatrix<double>::~TPZFMatrix(&local_140);
  TPZFMatrix<double>::~TPZFMatrix(&local_260);
  TPZFMatrix<double>::~TPZFMatrix(&local_1d0);
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::TransformShape(const TPZFMatrix<REAL> &phiref,
                                            const REAL detjac,
                                            const TPZFMatrix<REAL> &jacinv,
                                            const TPZFMatrix<REAL> &axes,
                                            TPZFMatrix<REAL> &phi)
{

    //applies covariant piola transform and compute the deformed vectors
    TPZFMatrix<REAL> axest, jacinvt;
    jacinv.Transpose(&jacinvt);
    axes.Transpose(&axest);

    (axest * (jacinvt * phiref)).Transpose(&phi);
}